

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

void __thiscall
Analyzer::updateNearestAssignmentsAfterCheck(Analyzer *this,Node *parent,Node *n,int i)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  Node *node_00;
  char *pcVar4;
  int in_ECX;
  long in_RDX;
  Analyzer *in_RSI;
  Analyzer *in_RDI;
  int j_1;
  char *functionName;
  int j;
  Node *node;
  Node *in_stack_00000158;
  Analyzer *in_stack_00000160;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  Analyzer *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  updateNearestAssignments(in_stack_00000160,in_stack_00000158);
  if ((*(int *)(in_RDX + 0x10) != 0xf) ||
     (((((**(int **)(in_RDX + 8) != 6 && (**(int **)(in_RDX + 8) != 0x27)) &&
        (**(int **)(in_RDX + 8) != 0x29)) &&
       ((**(int **)(in_RDX + 8) != 0x28 && (**(int **)(in_RDX + 8) != 0x2a)))) &&
      (**(int **)(in_RDX + 8) != 0x25)))) goto LAB_00153ee1;
  std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),0);
  bVar1 = isVarCanBeNull(in_stack_ffffffffffffffc8,
                         (Node *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
LAB_00153ea4:
    if ((**(int **)(in_RDX + 8) != 6) && (**(int **)(in_RDX + 8) != 0x25)) goto LAB_00153ee1;
  }
  else {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),0);
    bVar1 = isVarCanBeString(in_RSI,(Node *)CONCAT44(in_stack_ffffffffffffffd4,
                                                     in_stack_ffffffffffffffd0));
    if (bVar1) goto LAB_00153ea4;
  }
  std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),0);
  removeNearestAssignmentsFoundAt
            ((Analyzer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (Node *)in_stack_ffffffffffffffc8);
LAB_00153ee1:
  if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      == 0x22) {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
              ((vector<Node_*,_std::allocator<Node_*>_> *)
               &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (long)in_ECX);
    removeNearestAssignmentsExcludeString
              ((Analyzer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(Node *)in_RSI);
  }
  if ((*(int *)(in_RDX + 0x10) == 0x23) || (*(int *)(in_RDX + 0x10) == 0x24)) {
    in_stack_ffffffffffffffb4 = 1;
    while (in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffb4,
          sVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18)),
          in_stack_ffffffffffffffb4 < (int)sVar3) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),
                 (long)in_stack_ffffffffffffffd4);
      removeNearestAssignmentsFoundAt
                ((Analyzer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Node *)in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffd4 + 1;
    }
  }
  if ((*(int *)(in_RDX + 0x10) == 0x17) || (*(int *)(in_RDX + 0x10) == 0x18)) {
    node_00 = (Node *)getFunctionName(in_RDI,(Node *)CONCAT44(in_stack_ffffffffffffffb4,
                                                              in_stack_ffffffffffffffb0));
    bVar1 = isTestPresentInNodePath
                      (in_RDI,(Node *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if ((bVar1) ||
       ((pcVar4 = strstr((char *)node_00,"assert"), pcVar4 != (char *)0x0 ||
        (iVar2 = strcmp((char *)node_00,"type"), iVar2 == 0)))) {
      iVar2 = 1;
      while (iVar5 = iVar2,
            sVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18)),
            iVar2 < (int)sVar3) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDX + 0x18),(long)iVar5);
        removeNearestAssignmentsFoundAt
                  ((Analyzer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),node_00
                  );
        iVar2 = iVar5 + 1;
      }
    }
  }
  if ((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       == 0x21) &&
     (((((*(int *)(in_RDX + 0x10) == 0x27 || (*(int *)(in_RDX + 0x10) == 0x28)) ||
        (*(int *)(in_RDX + 0x10) == 0x2f)) ||
       (((*(int *)(in_RDX + 0x10) == 0x2e || (*(int *)(in_RDX + 0x10) == 0x2c)) ||
        ((*(int *)(in_RDX + 0x10) == 0x23 ||
         ((*(int *)(in_RDX + 0x10) == 0x24 || (*(int *)(in_RDX + 0x10) == 0x32)))))))) ||
      ((*(int *)(in_RDX + 0x10) == 0x25 || (*(int *)(in_RDX + 0x10) == 0x26)))))) {
    std::
    vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
    ::clear((vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
             *)0x1540c7);
  }
  return;
}

Assistant:

void updateNearestAssignmentsAfterCheck(Node * parent, Node * n, int i)
  {
    Node * node = parent;
    updateNearestAssignments(n);

    if (n->nodeType == PNT_BINARY_OP && (n->tok.type == TK_ASSIGN || n->tok.type == TK_PLUSEQ || n->tok.type == TK_MULEQ ||
      n->tok.type == TK_MINUSEQ || n->tok.type == TK_DIVEQ || n->tok.type == TK_NEWSLOT))
    {
      if ((!isVarCanBeNull(n->children[0]) && !isVarCanBeString(n->children[0])) ||
        n->tok.type == TK_ASSIGN || n->tok.type == TK_NEWSLOT)
      {
        removeNearestAssignmentsFoundAt(n->children[0]);
      }
    }

    if (node->nodeType == PNT_IF_ELSE)
      removeNearestAssignmentsExcludeString(node->children[i]);


    if (n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP)
    {
      for (int j = 1; j < int(n->children.size()); j++)
        removeNearestAssignmentsFoundAt(n->children[j]);
    }

    if (n->nodeType == PNT_FUNCTION_CALL || n->nodeType == PNT_FUNCTION_CALL_IF_NOT_NULL)
    {
      const char * functionName = getFunctionName(n);
      if (isTestPresentInNodePath(n) || strstr(functionName, "assert") || strcmp(functionName, "type") == 0)
        for (int j = 1; j < int(n->children.size()); j++)
          removeNearestAssignmentsFoundAt(n->children[j]);
    }


    if (node->nodeType == PNT_STATEMENT_LIST)
      if (n->nodeType == PNT_LOCAL_FUNCTION || n->nodeType == PNT_FUNCTION ||
        n->nodeType == PNT_CONTINUE || n->nodeType == PNT_BREAK || n->nodeType == PNT_RETURN ||
        n->nodeType == PNT_WHILE_LOOP || n->nodeType == PNT_DO_WHILE_LOOP ||
        n->nodeType == PNT_SWITCH_STATEMENT || n->nodeType == PNT_FOR_LOOP ||
        n->nodeType == PNT_FOR_EACH_LOOP)
      {
        nearest_assignments.clear();
      }
  }